

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O2

int replay_get_next_recorded_victim_internal(__cilkrts_worker *w)

{
  replay_entry_t *prVar1;
  
  prVar1 = w->l->replay_list_entry;
  if (prVar1->m_type == ped_type_steal) {
    return (int)prVar1->m_value;
  }
  return -1;
}

Assistant:

int replay_get_next_recorded_victim_internal(__cilkrts_worker *w)
{
    // If the next record isn't a STEAL, abort the attempt to steal work
    if (ped_type_steal != w->l->replay_list_entry->m_type)
        return -1;

    // Return the victim's worker ID from the STEAL record.  We'll check
    // the pedigree after random_steal has locked the victim worker.
    return w->l->replay_list_entry->m_value;
}